

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenBrOnSetRef(BinaryenExpressionRef expr,BinaryenExpressionRef refExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef refExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::BrOn>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<BrOn>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x1029,"void BinaryenBrOnSetRef(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (refExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)refExpr;
    return;
  }
  __assert_fail("refExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x102a,"void BinaryenBrOnSetRef(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenBrOnSetRef(BinaryenExpressionRef expr,
                        BinaryenExpressionRef refExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<BrOn>());
  assert(refExpr);
  static_cast<BrOn*>(expression)->ref = (Expression*)refExpr;
}